

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O0

char * __thiscall FParser::GetTokens(FParser *this,char *s)

{
  char *pcVar1;
  char c;
  bool bVar2;
  char *local_20;
  char *tokn;
  char *s_local;
  FParser *this_local;
  
  local_20 = (char *)0x0;
  this->Rover = s;
  this->NumTokens = 1;
  *this->Tokens[0] = '\0';
  this->TokenType[this->NumTokens + -1] = name_;
  this->Section = (DFsSection *)0x0;
  NextToken(this);
  this->LineStart = this->Rover;
  if (*this->Rover == '\0') {
LAB_0073d6e7:
    if ((local_20 == (char *)0x0) || (*local_20 == '\0')) {
      this->NumTokens = this->NumTokens + -1;
    }
    this->Rover = this->Rover + 1;
    return this->Rover;
  }
LAB_0073d429:
  do {
    local_20 = this->Tokens[this->NumTokens + -1];
    if ((this->Section != (DFsSection *)0x0) ||
       ((this->TokenType[this->NumTokens + -1] != string_ && (*this->Rover == ';'))))
    goto LAB_0073d6e7;
    switch(this->TokenType[this->NumTokens + -1]) {
    case name_:
      while (bVar2 = isop((int)*this->Rover), ((bVar2 ^ 0xffU) & 1) != 0) {
        pcVar1 = this->Rover;
        this->Rover = pcVar1 + 1;
        add_char(local_20,*pcVar1);
      }
      NextToken(this);
      goto LAB_0073d429;
    case number:
      while( true ) {
        if ((*this->Rover < '0') || (bVar2 = true, '9' < *this->Rover)) {
          bVar2 = *this->Rover == '.';
        }
        if (!bVar2) break;
        pcVar1 = this->Rover;
        this->Rover = pcVar1 + 1;
        add_char(local_20,*pcVar1);
      }
      NextToken(this);
      goto LAB_0073d429;
    case operator_:
      if ((((*local_20 != '\0') && (*this->Rover != '=')) && (*this->Rover != *local_20)) ||
         ((*local_20 == '(' || (*local_20 == ')')))) {
        NextToken(this);
        goto LAB_0073d429;
      }
      add_char(local_20,*this->Rover);
      break;
    case string_:
    case unset:
      goto switchD_0073d4ba_caseD_3;
    }
    this->Rover = this->Rover + 1;
  } while( true );
switchD_0073d4ba_caseD_3:
  while (*this->Rover != '\"') {
    if (*this->Rover == '\\') {
      this->Rover = this->Rover + 1;
      if ((*this->Rover < '0') || ('9' < *this->Rover)) {
        c = escape_sequence(*this->Rover);
        add_char(local_20,c);
      }
      else {
        add_char(local_20,'\x1c');
        add_char(local_20,*this->Rover + '\x11');
      }
    }
    else {
      add_char(local_20,*this->Rover);
    }
    this->Rover = this->Rover + 1;
  }
  this->Rover = this->Rover + 1;
  NextToken(this);
  goto LAB_0073d429;
}

Assistant:

char *FParser::GetTokens(char *s)
{
	char *tokn = NULL;

	Rover = s;
	NumTokens = 1;
	Tokens[0][0] = 0; TokenType[NumTokens-1] = name_;
	
	Section = NULL;   // default to no section found
	
	NextToken();
	LineStart = Rover;      // save the start
	
	if(*Rover)
	{
		while(1)
		{
			tokn = Tokens[NumTokens-1];
			if(Section)
			{
				// a { or } section brace has been found
				break;        // stop parsing now
			}
			else if(TokenType[NumTokens-1] != string_)
			{
				if(*Rover == ';') break;     // check for end of command ';'
			}
			
			switch(TokenType[NumTokens-1])
			{
			case unset:
			case string_:
				while(*Rover != '\"')     // dedicated loop for speed
				{
					if(*Rover == '\\')       // escape sequences
					{
						Rover++;
						if (*Rover>='0' && *Rover<='9')
						{
							add_char(tokn, TEXTCOLOR_ESCAPE);
							add_char(tokn, *Rover+'A'-'0');
						}
						else add_char(tokn, escape_sequence(*Rover));
					}
					else
						add_char(tokn, *Rover);
					Rover++;
				}
				Rover++;
				NextToken();       // end of this token
				continue;
				
			case operator_:
				// all 2-character operators either end in '=' or
				// are 2 of the same character
				// do not allow 2-characters for brackets '(' ')'
				// which are still being considered as operators
				
				// operators are only 2-char max, do not need
				// a seperate loop
				
				if((*tokn && *Rover != '=' && *Rover!=*tokn) ||
					*tokn == '(' || *tokn == ')')
				{
					// end of operator
					NextToken();
					continue;
				}
				add_char(tokn, *Rover);
				break;
				
			case number:
				
				// haleyjd: 8-17
				// add while number chars are read
				
				while(isnum(*Rover))       // dedicated loop
					add_char(tokn, *Rover++);
				NextToken();
				continue;
				
			case name_:
				
				// add the chars
				
				while(!isop(*Rover))        // dedicated loop
					add_char(tokn, *Rover++);
				NextToken();
				continue;
				
			default:
				break;
			}
			Rover++;
		}
	}
		
	// check for empty last token
	
	if(!tokn || !tokn[0])
	{
		NumTokens = NumTokens - 1;
	}
	
	Rover++;
	return Rover;
}